

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dupprintf.c
# Opt level: O1

char * dupvprintf_inner(char *buf,size_t oldlen,size_t *sizeptr,char *fmt,__va_list_tag *ap)

{
  bool bVar1;
  uint uVar2;
  char *ptr;
  size_t oldlen_00;
  size_t extralen;
  size_t size;
  va_list aq;
  size_t local_60;
  char *local_58;
  size_t *local_50;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_60 = *sizeptr;
  local_50 = sizeptr;
  ptr = (char *)safegrowarray(buf,&local_60,1,oldlen,0x200,true);
  do {
    local_38 = ap->reg_save_area;
    local_48._0_4_ = ap->gp_offset;
    local_48._4_4_ = ap->fp_offset;
    pvStack_40 = ap->overflow_arg_area;
    uVar2 = vsnprintf(ptr + oldlen,local_60 - oldlen,fmt,&local_48);
    extralen = (size_t)uVar2;
    if (((int)uVar2 < 0) || (local_60 <= extralen)) {
      oldlen_00 = oldlen + 1;
      if ((int)uVar2 < 1) {
        extralen = 1;
        oldlen_00 = local_60;
      }
      ptr = (char *)safegrowarray(ptr,&local_60,1,oldlen_00,extralen,true);
      bVar1 = true;
    }
    else {
      *local_50 = local_60;
      bVar1 = false;
      local_58 = ptr;
    }
  } while (bVar1);
  return local_58;
}

Assistant:

char *dupvprintf_inner(char *buf, size_t oldlen, size_t *sizeptr,
                       const char *fmt, va_list ap)
{
    size_t size = *sizeptr;
    sgrowarrayn_nm(buf, size, oldlen, 512);

    while (1) {
        va_list aq;
        va_copy(aq, ap);
        int len = vsnprintf(buf + oldlen, size - oldlen, fmt, aq);
        va_end(aq);

        if (len >= 0 && len < size) {
            /* This is the C99-specified criterion for snprintf to have
             * been completely successful. */
            *sizeptr = size;
            return buf;
        } else if (len > 0) {
            /* This is the C99 error condition: the returned length is
             * the required buffer size not counting the NUL. */
            sgrowarrayn_nm(buf, size, oldlen + 1, len);
        } else {
            /* This is the pre-C99 glibc error condition: <0 means the
             * buffer wasn't big enough, so we enlarge it a bit and hope. */
            sgrowarray_nm(buf, size, size);
        }
    }
}